

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O0

void __thiscall
absl::strings_internal::BigUnsigned<4>::BigUnsigned(BigUnsigned<4> *this,string_view sv)

{
  bool bVar1;
  int iVar2;
  const_iterator pvVar3;
  const_iterator __last;
  char *pcVar4;
  const_pointer begin;
  const_pointer pvVar5;
  size_type sVar6;
  uint32_t *local_30;
  int exponent_adjust;
  BigUnsigned<4> *this_local;
  string_view sv_local;
  
  sv_local._M_len = (size_t)sv._M_str;
  this_local = (BigUnsigned<4> *)sv._M_len;
  this->size_ = 0;
  local_30 = this->words_;
  do {
    *local_30 = 0;
    local_30 = local_30 + 1;
  } while ((BigUnsigned<4> *)local_30 != this + 1);
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  __last = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  pcVar4 = std::find_if_not<char_const*,bool(*)(unsigned_char)>(pvVar3,__last,ascii_isdigit);
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if ((pcVar4 == pvVar3) &&
     (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local), !bVar1))
  {
    begin = std::basic_string_view<char,_std::char_traits<char>_>::data
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    iVar2 = Digits10();
    iVar2 = ReadDigits(this,begin,pvVar5 + sVar6,iVar2 + 1);
    if (0 < iVar2) {
      MultiplyByTenToTheNth(this,iVar2);
    }
  }
  return;
}

Assistant:

explicit BigUnsigned(absl::string_view sv) : size_(0), words_{} {
    // Check for valid input, returning a 0 otherwise.  This is reasonable
    // behavior only because this constructor is for unit tests.
    if (std::find_if_not(sv.begin(), sv.end(), ascii_isdigit) != sv.end() ||
        sv.empty()) {
      return;
    }
    int exponent_adjust =
        ReadDigits(sv.data(), sv.data() + sv.size(), Digits10() + 1);
    if (exponent_adjust > 0) {
      MultiplyByTenToTheNth(exponent_adjust);
    }
  }